

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

String * kj::anon_unknown_36::generateWebSocketAccept(String *__return_storage_ptr__,StringPtr key)

{
  undefined1 in_R8B;
  byte digest [20];
  SHA1_CTX ctx;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  SHA1_CTX local_74;
  
  local_78 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_74.state[0] = 0x67452301;
  local_74.state[1] = 0xefcdab89;
  local_74.state[2] = 0x98badcfe;
  local_74.state[3] = 0x10325476;
  local_74.state[4] = 0xc3d2e1f0;
  local_74.count[0] = 0;
  local_74.count[1] = 0;
  SHA1Update(&local_74,(uchar *)key.content.ptr,(int)key.content.size_ - 1);
  SHA1Update(&local_74,(anonymous_namespace)::WEBSOCKET_GUID,0x24);
  SHA1Final((uchar *)&local_88,&local_74);
  encodeBase64(__return_storage_ptr__,(kj *)&local_88,(ArrayPtr<const_unsigned_char>)ZEXT816(0x14),
               (bool)in_R8B);
  return __return_storage_ptr__;
}

Assistant:

static kj::String generateWebSocketAccept(kj::StringPtr key) {
  // WebSocket demands we do a SHA-1 here. ARRGHH WHY SHA-1 WHYYYYYY?
  SHA1_CTX ctx;
  byte digest[20]{};
  SHA1Init(&ctx);
  SHA1Update(&ctx, key.asBytes().begin(), key.size());
  SHA1Update(&ctx, reinterpret_cast<const byte*>(WEBSOCKET_GUID), strlen(WEBSOCKET_GUID));
  SHA1Final(digest, &ctx);
  return kj::encodeBase64(digest);
}